

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_wait_cthread.cpp
# Opt level: O2

__pid_t __thiscall sc_core::wait(sc_core *this,void *__stat_loc)

{
  __pid_t extraout_EAX;
  __pid_t extraout_EAX_00;
  __pid_t _Var1;
  ostream *this_00;
  int n;
  char *local_1b8;
  stringstream msg;
  ostream local_188 [376];
  
  n = (int)this;
  if (n < 1) {
    std::__cxx11::stringstream::stringstream((stringstream *)&msg);
    this_00 = std::operator<<(local_188,"n = ");
    std::ostream::operator<<((ostream *)this_00,n);
    std::__cxx11::stringbuf::str();
    sc_report_handler::report
              (SC_ERROR,"wait(n) is only valid for n > 0",local_1b8,
               "/workspace/llm4binary/github/license_all_cmakelists_25/ucirvinelecs[P]systemc/src/sysc/kernel/sc_wait_cthread.cpp"
               ,0x44);
    std::__cxx11::string::_M_dispose();
    std::__cxx11::stringstream::~stringstream((stringstream *)&msg);
  }
  if ((*(uint *)((long)__stat_loc + 0x48) & 0xfffffffe) == 2) {
    sc_thread_process::wait_cycles(*(sc_thread_process **)((long)__stat_loc + 0x40),n);
    _Var1 = extraout_EAX;
  }
  else {
    sc_report_handler::report
              (SC_ERROR,"wait() is only allowed in SC_THREADs and SC_CTHREADs",
               "\n        in SC_METHODs use next_trigger() instead",
               "/workspace/llm4binary/github/license_all_cmakelists_25/ucirvinelecs[P]systemc/src/sysc/kernel/sc_wait_cthread.cpp"
               ,0x4d);
    _Var1 = extraout_EAX_00;
  }
  return _Var1;
}

Assistant:

void
wait( int n, sc_simcontext* simc )
{
    sc_curr_proc_handle cpi = simc->get_curr_proc_info();
    if( n <= 0 ) {
        std::stringstream msg;
        msg << "n = " << n;
        SC_REPORT_ERROR( SC_ID_WAIT_N_INVALID_, msg.str().c_str() );
    }
    switch( cpi->kind ) {
      case SC_THREAD_PROC_:
      case SC_CTHREAD_PROC_:
        reinterpret_cast<sc_thread_handle>( cpi->process_handle )->wait_cycles( n );
        break;
      default:
        SC_REPORT_ERROR( SC_ID_WAIT_NOT_ALLOWED_, "\n        "
	                 "in SC_METHODs use next_trigger() instead" );
        break;
    }
}